

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

float pbrt::findCameraFov(SP *camera)

{
  bool bVar1;
  element_type *peVar2;
  ostream *this;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  ParamArray<float> *this_00;
  string *name;
  ParamSet *this_01;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  undefined1 local_41 [33];
  __shared_ptr local_20 [28];
  float local_4;
  
  peVar2 = std::
           __shared_ptr_access<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1af0d9);
  name = (string *)&(peVar2->super_Node).super_ParamSet;
  this_01 = (ParamSet *)local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  syntactic::ParamSet::findParam<float>(this_01,name);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  std::shared_ptr<pbrt::syntactic::ParamArray<float>_>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::ParamArray<float>_> *)0x1af14b);
  std::__cxx11::string::~string((string *)(local_41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    peVar2 = std::
             __shared_ptr_access<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1af1ee);
    this_00 = (ParamArray<float> *)&(peVar2->super_Node).super_ParamSet;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    syntactic::ParamSet::findParam<float>(this_01,name);
    std::
    __shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1af23e);
    local_4 = syntactic::ParamArray<float>::get
                        (this_00,CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    std::shared_ptr<pbrt::syntactic::ParamArray<float>_>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::ParamArray<float>_> *)0x1af26b);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  }
  else {
    this = std::operator<<((ostream *)&std::cerr,
                           "warning - pbrt file has camera, but camera has no \'fov\' field; replacing with constant 30 degrees"
                          );
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_4 = 30.0;
  }
  return local_4;
}

Assistant:

float findCameraFov(pbrt::syntactic::Camera::SP camera)
  {
    if (!camera->findParam<float>("fov")) {
      std::cerr << "warning - pbrt file has camera, but camera has no 'fov' field; replacing with constant 30 degrees" << std::endl;
      return 30;
    }
    return camera->findParam<float>("fov")->get(0);
  }